

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

NondegeneracyCheckResult * __thiscall
slang::ast::AssertionExpr::checkNondegeneracy(AssertionExpr *this)

{
  NondegeneracyCheckResult *in_RDI;
  NondegeneracyCheckVisitor *in_stack_00000008;
  NondegeneracyCheckVisitor visitor;
  
  visit<(anonymous_namespace)::NondegeneracyCheckVisitor>(this,in_stack_00000008);
  return in_RDI;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult AssertionExpr::checkNondegeneracy() const {
    NondegeneracyCheckVisitor visitor;
    return visit(visitor);
}